

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_root.cpp
# Opt level: O3

error_code __thiscall anon_unknown.dwarf_780f1f::root_object::key(root_object *this,string *key)

{
  int iVar1;
  error_code eVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)key);
  if (iVar1 == 0) {
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 1;
    eVar2 = pstore::exchange::import_ns::rule::
            push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                      (&this->super_rule,&this->version_);
    return eVar2;
  }
  iVar1 = std::__cxx11::string::compare((char *)key);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)key);
    if (iVar1 != 0) {
      eVar2 = pstore::exchange::import_ns::make_error_code(unrecognized_root_key);
      return eVar2;
    }
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 4;
    eVar2 = pstore::exchange::import_ns::rule::
            push<pstore::exchange::import_ns::transaction_array<pstore::lock_guard<pstore::transaction_mutex>>,pstore::exchange::import_ns::string_mapping*,pstore::exchange::import_ns::string_mapping*>
                      (&this->super_rule,&this->names_,&this->paths_);
    return eVar2;
  }
  *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
       (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 2;
  eVar2 = pstore::exchange::import_ns::rule::
          push<pstore::exchange::import_ns::uuid_rule,pstore::uuid*>(&this->super_rule,&this->id_);
  return eVar2;
}

Assistant:

std::error_code root_object::key (std::string const & key) {
        using pstore::exchange::import_ns::error;
        using pstore::exchange::import_ns::transaction_array;
        using pstore::exchange::import_ns::uint64_rule;
        using pstore::exchange::import_ns::uuid_rule;

        // TODO: check that 'version' is the first key that we see.
        if (key == "version") {
            seen_[version] = true;
            return push<uint64_rule> (&version_);
        }
        if (key == "id") {
            seen_[id] = true;
            return push<uuid_rule> (&id_);
        }
        if (key == "transactions") {
            seen_[transactions] = true;
            return push<transaction_array<pstore::transaction_lock>> (&names_, &paths_);
        }
        return error::unrecognized_root_key;
    }